

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

string * __thiscall
cmCTestSVN::LoadInfo_abi_cxx11_(string *__return_storage_ptr__,cmCTestSVN *this,SVNInfo *svninfo)

{
  vector<const_char_*,_std::allocator<const_char_*>_> svn_info;
  OutputLogger err;
  InfoParser out;
  vector<const_char_*,_std::allocator<const_char_*>_> local_338;
  OutputLogger local_320;
  InfoParser local_2e0;
  
  local_338.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x7787e6;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_338,(char **)&local_2e0);
  local_2e0.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)(svninfo->LocalPath)._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_338,(char **)&local_2e0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  InfoParser::InfoParser(&local_2e0,this,"info-out> ",__return_storage_ptr__,svninfo);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_320,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"info-err> ");
  RunSVNCommand(this,&local_338,(OutputParser *)&local_2e0,(OutputParser *)&local_320);
  local_320.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_0094e948;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.super_LineParser.Line._M_dataplus._M_p !=
      &local_320.super_LineParser.Line.field_2) {
    operator_delete(local_320.super_LineParser.Line._M_dataplus._M_p,
                    local_320.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_2e0.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__InfoParser_0094b4f0;
  if (local_2e0.RegexRoot.program != (char *)0x0) {
    operator_delete__(local_2e0.RegexRoot.program);
  }
  if (local_2e0.RegexURL.program != (char *)0x0) {
    operator_delete__(local_2e0.RegexURL.program);
  }
  if (local_2e0.RegexRev.program != (char *)0x0) {
    operator_delete__(local_2e0.RegexRev.program);
  }
  local_2e0.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_0094e948;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0.super_LineParser.Line._M_dataplus._M_p !=
      &local_2e0.super_LineParser.Line.field_2) {
    operator_delete(local_2e0.super_LineParser.Line._M_dataplus._M_p,
                    local_2e0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  if (local_338.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestSVN::LoadInfo(SVNInfo& svninfo)
{
  // Run "svn info" to get the repository info from the work tree.
  std::vector<const char*> svn_info;
  svn_info.push_back("info");
  svn_info.push_back(svninfo.LocalPath.c_str());
  std::string rev;
  InfoParser out(this, "info-out> ", rev, svninfo);
  OutputLogger err(this->Log, "info-err> ");
  this->RunSVNCommand(svn_info, &out, &err);
  return rev;
}